

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O2

void __thiscall
absl::lts_20250127::SubstituteAndAppend
          (lts_20250127 *this,Nonnull<std::string_*> output,string_view format,Arg *a0,Arg *a1,
          Arg *a2,Arg *a3,Arg *a4)

{
  string_view format_00;
  string_view args [5];
  
  format_00._M_len = format._M_len;
  args[0]._M_len = *(size_t *)format._M_str;
  args[0]._M_str = *(char **)((long)format._M_str + 8);
  args[1]._M_len = (a0->piece_)._M_len;
  args[1]._M_str = (a0->piece_)._M_str;
  args[2]._M_len = (a1->piece_)._M_len;
  args[2]._M_str = (a1->piece_)._M_str;
  args[3]._M_len = (a2->piece_)._M_len;
  args[3]._M_str = (a2->piece_)._M_str;
  args[4]._M_len = (a3->piece_)._M_len;
  args[4]._M_str = (a3->piece_)._M_str;
  format_00._M_str = (char *)args;
  substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)this,output,format_00,(Nullable<const_absl::string_view_*>)0x5,
             (size_t)a1);
  return;
}

Assistant:

inline void SubstituteAndAppend(absl::Nonnull<std::string*> output,
                                absl::string_view format,
                                const substitute_internal::Arg& a0,
                                const substitute_internal::Arg& a1,
                                const substitute_internal::Arg& a2,
                                const substitute_internal::Arg& a3,
                                const substitute_internal::Arg& a4) {
  const absl::string_view args[] = {a0.piece(), a1.piece(), a2.piece(),
                                    a3.piece(), a4.piece()};
  substitute_internal::SubstituteAndAppendArray(output, format, args,
                                                ABSL_ARRAYSIZE(args));
}